

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::MpRepeatedVarintT<true,unsigned_int,(unsigned_short)0>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  ushort uVar4;
  undefined1 auVar5 [12];
  bool bVar6;
  void *pvVar7;
  RepeatedField<unsigned_int> *this;
  ulong uVar8;
  char *pcVar9;
  uint32_t *data_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar10;
  ParseContext *ctx_00;
  ulong uVar11;
  Arena *this_00;
  uint uVar12;
  uint *puVar13;
  ulong uVar14;
  long *plVar15;
  byte *p;
  pair<const_char_*,_unsigned_int> pVar16;
  int local_58;
  int local_50;
  int local_40;
  Arena *local_38;
  
  puVar13 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar13 & 3) != 0) {
    AlignFail(puVar13);
  }
  uVar4 = *(ushort *)((long)puVar13 + 10);
  pvVar7 = MaybeGetSplitBase(msg,true,table);
  plVar15 = (long *)((ulong)*puVar13 + (long)pvVar7);
  if (((ulong)plVar15 & 7) != 0) {
    AlignFail(plVar15);
  }
  this = (RepeatedField<unsigned_int> *)*plVar15;
  if (this == (RepeatedField<unsigned_int> *)kZeroBuffer) {
    this_00 = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)this_00 & 1) != 0) {
      this_00 = *(Arena **)((ulong)this_00 & 0xfffffffffffffffe);
    }
    if (this_00 == (Arena *)0x0) {
      this = (RepeatedField<unsigned_int> *)operator_new(0x10);
      RepeatedField<unsigned_int>::RepeatedField(this,(Arena *)0x0);
    }
    else {
      pvVar7 = Arena::Allocate(this_00,0x10);
      local_38 = this_00;
      this = Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_int>>::
             Construct<google::protobuf::Arena*>(pvVar7,&local_38);
    }
    *plVar15 = (long)this;
  }
  if ((uVar4 >> 10 & 1) == 0) {
    data_00 = (uint32_t *)0x0;
  }
  else {
    data_00 = *(uint32_t **)
               ((long)&table->has_bits_offset +
               (ulong)(ushort)puVar13[2] * 8 + (ulong)table->aux_offset);
  }
  do {
    uVar14 = (ulong)*ptr;
    if ((long)uVar14 < 0) {
      uVar8 = (long)ptr[1] << 7 | 0x7f;
      if ((long)uVar8 < 0) {
        aVar10.data = (long)ptr[2] << 0xe | 0x3fff;
        if ((long)aVar10 < 0) {
          uVar8 = uVar8 & ((long)ptr[3] << 0x15 | 0x1fffffU);
          if ((long)uVar8 < 0) {
            pcVar9 = (char *)0xffffffffffffff80;
            aVar10.data = aVar10.data & ((long)ptr[4] << 0x1c | 0xfffffffU);
            if ((long)aVar10.data < 0) {
              uVar8 = uVar8 & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
              if ((long)uVar8 < 0) {
                aVar10.data = aVar10.data & ((long)ptr[6] << 0x2a | 0x3ffffffffffU);
                if ((long)aVar10 < 0) {
                  uVar8 = uVar8 & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
                  if ((long)uVar8 < 0) {
                    uVar11 = (ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff;
                    aVar10.data = aVar10.data & uVar11;
                    if ((long)aVar10 < 0) {
                      p = (byte *)(ptr + 10);
                      cVar3 = ptr[9];
                      ctx_00 = (ParseContext *)CONCAT71((int7)(uVar11 >> 8),cVar3);
                      if ((cVar3 != '\x01') && (cVar3 < '\0')) goto LAB_002cc447;
                    }
                    else {
                      p = (byte *)(ptr + 9);
                    }
                  }
                  else {
                    p = (byte *)(ptr + 8);
                  }
                }
                else {
                  p = (byte *)(ptr + 7);
                }
              }
              else {
                p = (byte *)(ptr + 6);
              }
            }
            else {
              p = (byte *)(ptr + 5);
            }
          }
          else {
            p = (byte *)(ptr + 4);
          }
        }
        else {
          p = (byte *)(ptr + 3);
        }
        uVar8 = uVar8 & aVar10.data;
      }
      else {
        p = (byte *)(ptr + 2);
      }
      uVar14 = uVar14 & uVar8;
    }
    else {
      p = (byte *)(ptr + 1);
    }
    uVar12 = (uint)uVar14;
    if ((uVar4 >> 10 & 1) == 0) {
      if ((uVar4 & 0x600) == 0x200) {
        uVar12 = -(uVar12 & 1) ^ (uint)(uVar14 >> 1) & 0x7fffffff;
      }
    }
    else if ((uVar4 & 0x600) == 0x600) {
      local_58 = (int)data_00;
      if (((int)uVar12 < local_58) ||
         (local_40 = (int)((ulong)data_00 >> 0x20), local_40 < (int)uVar12)) {
LAB_002cc418:
        pcVar9 = MpUnknownEnumFallback(msg,ptr,ctx,data,table,hasbits);
        return pcVar9;
      }
    }
    else {
      bVar6 = ValidateEnum(uVar12,data_00);
      if (!bVar6) goto LAB_002cc418;
    }
    RepeatedField<unsigned_int>::Add(this,uVar12);
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) break;
    bVar1 = *p;
    auVar5[8] = bVar1;
    auVar5._0_8_ = p + 1;
    auVar5._9_3_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = p[1];
      aVar10.data = (ulong)bVar2 << 7;
      uVar12 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pcVar9 = (char *)(ulong)uVar12;
        pVar16 = ReadTagFallback((char *)p,uVar12);
        auVar5 = pVar16._0_12_;
        ctx_00 = pVar16._8_8_;
        if (pVar16.first == (char *)0x0) {
LAB_002cc447:
          pcVar9 = Error(msg,pcVar9,ctx_00,(TcFieldData)aVar10,table,hasbits);
          return pcVar9;
        }
      }
      else {
        auVar5._8_4_ = uVar12;
        auVar5._0_8_ = p + 2;
      }
    }
    ptr = auVar5._0_8_;
    local_50 = data.field_0._0_4_;
  } while (auVar5._8_4_ == local_50);
  if ((ulong)table->has_bits_offset != 0) {
    puVar13 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar13 & 3) != 0) {
      AlignFail();
    }
    *puVar13 = *puVar13 | (uint)hasbits;
  }
  return (char *)p;
}

Assistant:

const char* TcParser::MpRepeatedVarintT(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  // For is_split we ignore the incoming xform_val and read it from entry to
  // reduce duplication for the uncommon paths.
  const uint16_t xform_val =
      is_split ? (entry.type_card & field_layout::kTvMask) : xform_val_in;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  const char* ptr2 = ptr;
  uint32_t next_tag;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  auto& field = MaybeCreateRepeatedFieldRefAt<FieldType, is_split>(
      base, entry.offset, msg);

  TcParseTableBase::FieldAux aux;
  if (is_validated_enum) {
    aux = *table->field_aux(&entry);
    PrefetchEnumData(xform_val, aux);
  }

  do {
    uint64_t tmp;
    ptr = ParseVarint(ptr2, &tmp);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (is_validated_enum) {
      if (!EnumIsValidAux(static_cast<int32_t>(tmp), xform_val, aux)) {
        ptr = ptr2;
        PROTOBUF_MUSTTAIL return MpUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
      }
    } else if (is_zigzag) {
      tmp = sizeof(FieldType) == 8 ? WireFormatLite::ZigZagDecode64(tmp)
                                   : WireFormatLite::ZigZagDecode32(tmp);
    }
    field.Add(static_cast<FieldType>(tmp));
    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);

parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}